

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tgt.c
# Opt level: O0

void opj_tgt_reset(opj_tgt_tree_t *p_tree)

{
  opj_tgt_node_t *local_20;
  opj_tgt_node_t *l_current_node;
  OPJ_UINT32 i;
  opj_tgt_tree_t *p_tree_local;
  
  if (p_tree != (opj_tgt_tree_t *)0x0) {
    local_20 = p_tree->nodes;
    for (l_current_node._4_4_ = 0; l_current_node._4_4_ < p_tree->numnodes;
        l_current_node._4_4_ = l_current_node._4_4_ + 1) {
      local_20->value = 999;
      local_20->low = 0;
      local_20->known = 0;
      local_20 = local_20 + 1;
    }
  }
  return;
}

Assistant:

void opj_tgt_reset(opj_tgt_tree_t *p_tree)
{
    OPJ_UINT32 i;
    opj_tgt_node_t * l_current_node = 00;;

    if (! p_tree) {
        return;
    }

    l_current_node = p_tree->nodes;
    for (i = 0; i < p_tree->numnodes; ++i) {
        l_current_node->value = 999;
        l_current_node->low = 0;
        l_current_node->known = 0;
        ++l_current_node;
    }
}